

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cecSweep.c
# Opt level: O3

void Cec_ManFraCreateInfo(Cec_ManSim_t *p,Vec_Ptr_t *vCiInfo,Vec_Ptr_t *vInfo,int nSeries)

{
  int iVar1;
  Vec_Int_t *pVVar2;
  void *pvVar3;
  void *pvVar4;
  long lVar5;
  int iVar6;
  long lVar7;
  
  pVVar2 = p->pAig->vCis;
  iVar6 = pVVar2->nSize;
  if (0 < iVar6) {
    lVar5 = 0;
    do {
      if ((vCiInfo->nSize <= lVar5) || (vInfo->nSize <= lVar5)) {
        __assert_fail("i >= 0 && i < p->nSize",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/misc/vec/vecPtr.h"
                      ,0x184,"void *Vec_PtrEntry(Vec_Ptr_t *, int)");
      }
      iVar1 = p->nWords;
      if (0 < iVar1) {
        pvVar3 = vCiInfo->pArray[lVar5];
        pvVar4 = vInfo->pArray[lVar5];
        lVar7 = 0;
        do {
          *(undefined4 *)((long)pvVar3 + lVar7 * 4) =
               *(undefined4 *)((long)pvVar4 + lVar7 * 4 + (long)(iVar1 * nSeries) * 4);
          lVar7 = lVar7 + 1;
        } while (lVar7 < p->nWords);
        iVar6 = pVVar2->nSize;
      }
      lVar5 = lVar5 + 1;
    } while (lVar5 < iVar6);
  }
  return;
}

Assistant:

void Cec_ManFraCreateInfo( Cec_ManSim_t * p, Vec_Ptr_t * vCiInfo, Vec_Ptr_t * vInfo, int nSeries )
{
    unsigned * pRes0, * pRes1;
    int i, w;
    for ( i = 0; i < Gia_ManCiNum(p->pAig); i++ )
    {
        pRes0 = (unsigned *)Vec_PtrEntry( vCiInfo, i );
        pRes1 = (unsigned *)Vec_PtrEntry( vInfo, i );
        pRes1 += p->nWords * nSeries;
        for ( w = 0; w < p->nWords; w++ )
            pRes0[w] = pRes1[w];
    }
}